

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall SQVM::CMP_OP_RESF(SQVM *this,CmpOP op,SQObjectPtr *o1,SQFloat o2,int *res)

{
  bool bVar1;
  long in_RAX;
  SQInteger r;
  long local_18;
  
  local_18 = in_RAX;
  bVar1 = ObjCmpF(this,o1,o2,&local_18);
  if (bVar1) {
    bVar1 = false;
    switch(op) {
    case CMP_G:
      local_18._0_4_ = (uint)(0 < local_18);
      break;
    default:
      goto switchD_00141e57_caseD_1;
    case CMP_GE:
      local_18._0_4_ = (uint)(-1 < local_18);
      break;
    case CMP_L:
      local_18._0_4_ = (uint)((ulong)local_18 >> 0x3f);
      break;
    case CMP_LE:
      local_18._0_4_ = (uint)(local_18 < 1);
      break;
    case CMP_3W:
    }
    *res = (uint)local_18;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
switchD_00141e57_caseD_1:
  return bVar1;
}

Assistant:

bool SQVM::CMP_OP_RESF(CmpOP op, const SQObjectPtr &o1,const SQFloat o2, int &res)
{
    SQInteger r;
    if(ObjCmpF(o1,o2,r)) {
        switch(op) {
            case CMP_G: res = (r > 0); return true;
            case CMP_GE: res = (r >= 0); return true;
            case CMP_L: res = (r < 0); return true;
            case CMP_LE: res = (r <= 0); return true;
            case CMP_3W: res = r; return true;
        }
        assert(0);
    }
    return false;
}